

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void teardown_testing(char *test_name)

{
  CleanupListValue in_RDI;
  
  list_free((ListNode *)test_name,in_RDI,(void *)0x186248);
  initialize_source_location((SourceLocation *)0x186260);
  list_free((ListNode *)test_name,in_RDI,(void *)0x186284);
  initialize_source_location((SourceLocation *)0x18629c);
  list_free((ListNode *)test_name,in_RDI,(void *)0x1862bf);
  initialize_source_location((SourceLocation *)0x1862d7);
  return;
}

Assistant:

static void teardown_testing(const char *test_name) {
    (void)test_name;
    list_free(&global_function_result_map_head, free_symbol_map_value,
              (void*)0);
    initialize_source_location(&global_last_mock_value_location);
    list_free(&global_function_parameter_map_head, free_symbol_map_value,
              (void*)1);
    initialize_source_location(&global_last_parameter_location);
    list_free(&global_call_ordering_head, free_value,
              (void*)0);
    initialize_source_location(&global_last_call_ordering_location);
}